

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ising_model.cc
# Opt level: O2

void wolff_main<trng::lagfib4xor<unsigned_int,471u,1586u,6988u,9689u>>
               (lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U> *R,long runs,long split,long L)

{
  double c_exact;
  double E_exact;
  ulong uVar1;
  ostream *poVar2;
  char *pcVar3;
  int j;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  double dVar8;
  double dVar9;
  double extraout_XMM0_Qa;
  double local_c0;
  double local_b0;
  lattice s;
  vector<double,_std::allocator<double>_> ca;
  vector<double,_std::allocator<double>_> Ea;
  timer t;
  
  uVar1 = L - 8U >> 2;
  if ((L << 0x3e | uVar1) < 0xf) {
    c_exact = *(double *)(&DAT_00110618 + uVar1 * 8);
    E_exact = *(double *)(&DAT_00110690 + uVar1 * 8);
    std::vector<double,_std::allocator<double>_>::vector(&Ea,0xc,(allocator_type *)&s);
    std::vector<double,_std::allocator<double>_>::vector(&ca,0xc,(allocator_type *)&s);
    lVar5 = std::cout;
    *(uint *)(atoi + *(long *)(std::cout + -0x18)) =
         *(uint *)(atoi + *(long *)(std::cout + -0x18)) | 4;
    *(uint *)(atoi + *(long *)(lVar5 + -0x18)) = *(uint *)(atoi + *(long *)(lVar5 + -0x18)) | 0x400;
    dVar8 = log1p(1.4142135623730951);
    lattice::lattice(&s,(int)L);
    lattice::fill(&s,-1);
    poVar2 = std::operator<<((ostream *)&std::cout,"Generator : ");
    pcVar3 = trng::lagfib4xor<unsigned_int,_471U,_1586U,_6988U,_9689U>::name();
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<(poVar2,"Splitting level : ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<(poVar2,'\n');
    std::operator<<(poVar2,"T = ");
    dVar8 = 2.0 / dVar8;
    poVar2 = std::ostream::_M_insert<double>(dVar8);
    poVar2 = std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<(poVar2,"Lattice = ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2,"x");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    poVar2 = std::operator<<(poVar2,'\n');
    poVar2 = std::operator<<(poVar2,"Samples = ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::operator<<(poVar2,'\n');
    lVar5 = 0;
    if (0 < runs * 2) {
      lVar5 = runs * 2;
    }
    while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
      wolffstep<trng::lagfib4xor<unsigned_int,471u,1586u,6988u,9689u>>(R,&s,dVar8);
    }
    t._resolution = 1e-06;
    t._t.__d.__r = (duration)std::chrono::_V2::system_clock::now();
    lVar4 = 0;
    lVar5 = runs;
    if (runs < 1) {
      lVar5 = lVar4;
    }
    for (; lVar4 != 10; lVar4 = lVar4 + 1) {
      local_c0 = 0.0;
      local_b0 = 0.0;
      lVar6 = lVar5;
      while (bVar7 = lVar6 != 0, lVar6 = lVar6 + -1, bVar7) {
        wolffstep<trng::lagfib4xor<unsigned_int,471u,1586u,6988u,9689u>>(R,&s,dVar8);
        dVar9 = lattice::energy(&s);
        local_c0 = local_c0 + dVar9;
        local_b0 = local_b0 + dVar9 * dVar9;
      }
      local_c0 = local_c0 / (double)runs;
      Ea.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] = local_c0;
      ca.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar4] =
           (local_b0 / (double)runs - local_c0 * local_c0) * ((double)(L * L) / (dVar8 * dVar8));
    }
    output(&Ea,&ca,10,E_exact,c_exact);
    poVar2 = std::operator<<((ostream *)&std::cout,'\n');
    pcVar3 = "Time: ";
    std::operator<<(poVar2,"Time: ");
    timer::time(&t,(time_t *)pcVar3);
    poVar2 = std::ostream::_M_insert<double>(extraout_XMM0_Qa);
    poVar2 = std::operator<<(poVar2," sec.");
    std::endl<char,std::char_traits<char>>(poVar2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&s);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&ca.super__Vector_base<double,_std::allocator<double>_>);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&Ea.super__Vector_base<double,_std::allocator<double>_>);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"invalid lattice size, try 8, 12, ..., 64\n");
  exit(1);
}

Assistant:

void wolff_main(RNG_type &R, long runs, long split, long L) {
  double E_exact, c_exact;
  switch (L) {
    case 8:
      E_exact = -1.4915891074397066;
      c_exact = 1.1455592398944086;
      break;
    case 12:
      E_exact = -1.4659608164862789;
      c_exact = 1.3529506829072697;
      break;
    case 16:
      E_exact = -1.4530648528134771;
      c_exact = 1.4987049594000261;
      break;
    case 20:
      E_exact = -1.4453094678058525;
      c_exact = 1.6111614949041113;
      break;
    case 24:
      E_exact = -1.4401334960573388;
      c_exact = 1.7027336877232671;
      break;
    case 28:
      E_exact = -1.4364340850836483;
      c_exact = 1.7799744882644384;
      break;
    case 32:
      E_exact = -1.4336584661462483;
      c_exact = 1.8467675900395589;
      break;
    case 36:
      E_exact = -1.4314991053179871;
      c_exact = 1.9056050418011437;
      break;
    case 40:
      E_exact = -1.4297713123073425;
      c_exact = 1.9581816502509387;
      break;
    case 44:
      E_exact = -1.4283574829971357;
      c_exact = 2.0057024700476327;
      break;
    case 48:
      E_exact = -1.4271791793855239;
      c_exact = 2.0490550151069595;
      break;
    case 52:
      E_exact = -1.4261820801536625;
      c_exact = 2.0889118621693695;
      break;
    case 56:
      E_exact = -1.4253273745116323;
      c_exact = 2.1257948956620735;
      break;
    case 60:
      E_exact = -1.4245865955789106;
      c_exact = 2.1601172105639529;
      break;
    case 64:
      E_exact = -1.4239383898330109;
      c_exact = 2.1922113931405711;
      break;
    default:
      std::cerr << "invalid lattice size, try 8, 12, ..., 64\n";
      std::exit(EXIT_FAILURE);
  }

  // const double
  const int simulations{10};
  std::vector<double> Ea(simulations + 2);
  std::vector<double> ca(simulations + 2);

  std::cout.setf(std::ios::fixed);
  std::cout.setf(std::ios::showpoint);
  const double T{2.0 / std::log1p(std::sqrt(2.0))};
  lattice s(L);
  s.fill(-1);
  std::cout << "Generator : " << R.name() << '\n'
            << "Splitting level : " << split << '\n'
            << '\n'
            << "T = " << T << '\n'
            << "Lattice = " << L << "x" << L << '\n'
            << "Samples = " << runs << '\n';

  for (int i{0}; i < 2 * runs; ++i)
    wolffstep(R, s, T);
  timer t;
  for (int j{0}; j < simulations; ++j) {
    double E{0.0};
    double E2{0.0};
    for (int i{0}; i < runs; ++i) {
      wolffstep(R, s, T);
      const double q{s.energy()};
      E += q;
      E2 += q * q;
    }
    E /= runs;
    E2 /= runs;
    double c = (L * L) / (T * T) * (E2 - E * E);
    Ea[j] = E;
    ca[j] = c;
  }
  output(Ea, ca, simulations, E_exact, c_exact);
  std::cout << '\n' << "Time: " << t.time() << " sec." << std::endl;
}